

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O3

QVariant * __thiscall
QSqlQueryModel::data
          (QVariant *__return_storage_ptr__,QSqlQueryModel *this,QModelIndex *item,int role)

{
  QSqlQueryModelPrivate *this_00;
  QExplicitlySharedDataPointer<QSqlErrorPrivate> QVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QSqlError local_50;
  int local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((-1 < item->r) && (-1 < item->c)) && ((item->m).ptr != (QAbstractItemModel *)0x0)) &&
     ((role & 0xfffffffdU) == 0)) {
    this_00 = *(QSqlQueryModelPrivate **)&this->field_0x8;
    bVar2 = QSqlRecord::isGenerated(&this_00->rec,item->c);
    if (bVar2) {
      local_38 = 0xaaaaaaaaaaaaaaaa;
      local_48 = -0x55555556;
      iStack_44 = -0x55555556;
      uStack_40 = 0xaaaaaaaa;
      uStack_3c = 0xaaaaaaaa;
      (**(code **)(*(long *)this + 0x198))(&local_48,this,item);
      if ((this_00->bottom).r < local_48) {
        QSqlQueryModelPrivate::prefetch(this_00,local_48);
      }
      bVar2 = QSqlQuery::seek(&this_00->query,local_48,false);
      if (bVar2) {
        QSqlQuery::value(__return_storage_ptr__,&this_00->query,iStack_44);
        goto LAB_0012c657;
      }
      QSqlQuery::lastError((QSqlQuery *)&local_50);
      QVar1.d.ptr = (totally_ordered_wrapper<QSqlErrorPrivate_*>)(this_00->error).d.d.ptr;
      (this_00->error).d.d.ptr = (QSqlErrorPrivate *)local_50.d.d.ptr;
      local_50.d.d.ptr =
           (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
           (QExplicitlySharedDataPointer<QSqlErrorPrivate>)QVar1.d.ptr;
      QSqlError::~QSqlError(&local_50);
    }
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_0012c657:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSqlQueryModel::data(const QModelIndex &item, int role) const
{
    Q_D(const QSqlQueryModel);
    if (!item.isValid())
        return QVariant();

    if (role & ~(Qt::DisplayRole | Qt::EditRole))
        return QVariant();

    if (!d->rec.isGenerated(item.column()))
        return QVariant();
    QModelIndex dItem = indexInQuery(item);
    if (dItem.row() > d->bottom.row())
        const_cast<QSqlQueryModelPrivate *>(d)->prefetch(dItem.row());

    if (!d->query.seek(dItem.row())) {
        d->error = d->query.lastError();
        return QVariant();
    }

    return d->query.value(dItem.column());
}